

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TeamCityOutputTest_TestGroupEscaped_End_TestShell::createTest
          (TEST_TeamCityOutputTest_TestGroupEscaped_End_TestShell *this)

{
  TEST_TeamCityOutputTest_TestGroupEscaped_End_Test *this_00;
  TEST_TeamCityOutputTest_TestGroupEscaped_End_TestShell *this_local;
  
  this_00 = (TEST_TeamCityOutputTest_TestGroupEscaped_End_Test *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0xac);
  TEST_TeamCityOutputTest_TestGroupEscaped_End_Test::
  TEST_TeamCityOutputTest_TestGroupEscaped_End_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TeamCityOutputTest, TestGroupEscaped_End)
{
	tst->setGroupName("'[]\n\r");
	result->currentGroupStarted(tst);
	result->currentGroupEnded(tst);
	const char* expected =
		"##teamcity[testSuiteStarted name='|'|[|]|n|r']\n"
		"##teamcity[testSuiteFinished name='|'|[|]|n|r']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}